

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O3

bool __thiscall Disa::Adjacency_Graph<false>::insert(Adjacency_Graph<false> *this,Edge *edge)

{
  unsigned_long *puVar1;
  long *plVar2;
  ulong uVar3;
  pointer puVar4;
  bool bVar5;
  long lVar6;
  pointer puVar7;
  ostream *poVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  source_location *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  size_t sVar11;
  unsigned_long uVar12;
  Edge *pEVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  size_type *local_f0;
  size_type local_e8;
  size_type local_e0;
  undefined8 uStack_d8;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined **local_30;
  
  puVar1 = &edge->second;
  if (edge->first == edge->second) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_30 = &PTR_s__workspace_llm4binary_github_lic_00164780;
    console_format_abi_cxx11_(&local_50,(Disa *)0x0,(Log_Level)&local_30,in_RCX);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__cxx11::to_string(&local_b0,edge->first);
    std::operator+(&local_90,"Edge vertices identical, ",&local_b0);
    pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_90," and ");
    local_110._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
    paVar10 = &pbVar9->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == paVar10) {
      local_110.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    local_110._M_string_length = pbVar9->_M_string_length;
    (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar9->_M_string_length = 0;
    (pbVar9->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::to_string(&local_d0,*puVar1);
    std::operator+(&local_70,&local_110,&local_d0);
    pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_70,".");
    local_f0 = (size_type *)(pbVar9->_M_dataplus)._M_p;
    paVar10 = &pbVar9->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0 == paVar10) {
      local_e0 = paVar10->_M_allocated_capacity;
      uStack_d8 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
      local_f0 = &local_e0;
    }
    else {
      local_e0 = paVar10->_M_allocated_capacity;
    }
    local_e8 = pbVar9->_M_string_length;
    (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar9->_M_string_length = 0;
    (pbVar9->field_2)._M_local_buf[0] = '\0';
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_f0,local_e8);
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    exit(1);
  }
  bVar5 = contains(this,edge);
  if (!bVar5) {
    uVar3 = edge->first;
    uVar12 = edge->second;
    sVar11 = uVar12;
    if (uVar3 >= uVar12 && uVar3 != uVar12) {
      sVar11 = uVar3;
    }
    pEVar13 = (Edge *)puVar1;
    if (uVar3 < uVar12) {
      pEVar13 = edge;
      edge = (Edge *)puVar1;
      uVar12 = uVar3;
    }
    lVar6 = (long)(this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if ((lVar6 == 0) || ((lVar6 >> 3) - 1U <= sVar11)) {
      local_50._M_dataplus._M_p = (pointer)(sVar11 + 1);
      resize(this,(size_t *)&local_50);
      uVar12 = pEVar13->first;
      sVar11 = edge->first;
    }
    insert_vertex_adjacent_list(this,uVar12,sVar11);
    puVar4 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    sVar11 = pEVar13->first;
    uVar12 = edge->first;
    if (puVar4 + sVar11 + 1 != puVar4 + uVar12 + 2) {
      lVar6 = sVar11 << 3;
      do {
        plVar2 = (long *)((long)puVar4 + lVar6 + 8);
        *plVar2 = *plVar2 + 1;
        lVar6 = lVar6 + 8;
      } while (uVar12 * 8 + 8 != lVar6);
      uVar12 = edge->first;
      sVar11 = pEVar13->first;
    }
    insert_vertex_adjacent_list(this,uVar12,sVar11);
    puVar7 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar4 = puVar7 + edge->first + 1;
    *puVar4 = *puVar4 + 1;
    puVar4 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (puVar7 = puVar7 + edge->first + 2; puVar7 != puVar4; puVar7 = puVar7 + 1) {
      *puVar7 = *puVar7 + 2;
    }
  }
  return !bVar5;
}

Assistant:

bool Adjacency_Graph<_directed>::insert(const Edge& edge) {
  ASSERT_DEBUG(edge.first != edge.second,
               "Edge vertices identical, " + std::to_string(edge.first) + " and " + std::to_string(edge.second) + ".");

  // Preliminaries check if the edge exists, then determine if we need to resize.
  if(contains(edge)) return false;
  const auto& [i_first_vertex, i_second_vertex] =
  !_directed ? order_edge_vertex(&edge) : std::pair<const std::size_t&, const std::size_t&>({edge.first, edge.second});
  if(std::max(i_first_vertex, i_second_vertex) >= size_vertex()) resize(std::max(i_first_vertex, i_second_vertex) + 1);

  // Insert lower vertex.
  insert_vertex_adjacent_list(i_first_vertex, i_second_vertex);
  std::for_each(std::next(offset.begin(), static_cast<s_size_t>(i_first_vertex + 1)),
                !_directed ? std::next(offset.begin(), static_cast<s_size_t>(i_second_vertex + 2)) : offset.end(),
                [](std::size_t& off) { off++; });
  if(_directed) return true;

  // Insert upper vertex (tricky: last for loop is safe -> The highest vertex + 1 (for size) + 1 (for offset) <= end()).
  insert_vertex_adjacent_list(i_second_vertex, i_first_vertex);
  ++(*std::next(offset.begin(), static_cast<s_size_t>(i_second_vertex + 1)));
  std::for_each(std::next(offset.begin(), static_cast<s_size_t>(i_second_vertex + 2)), offset.end(),
                [](std::size_t& off) { off += 2; });

  return true;
}